

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O3

Am_Value option_button_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Value v;
  Am_Object sub_menu;
  Am_Value firstv;
  Am_Value_List items;
  Am_Value local_50;
  Am_Object local_40;
  Am_Value local_38;
  Am_Value_List local_28;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((Am_Object *)&local_50,(Am_Slot_Key)in_RSI,0x1d2);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_50,0x1d2);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  pAVar2 = Am_Object::Get(&local_40,0x169,1);
  Am_Value::operator=((Am_Value *)self,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)self);
  if (!bVar1) {
    local_50.type = 0;
    local_50.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar2 = Am_Object::Get(in_RSI,0xa2,1);
    Am_Value::operator=(&local_50,pAVar2);
    Am_Value::operator=((Am_Value *)self,&Am_No_Value);
    bVar1 = Am_Value::Valid(&local_50);
    if (bVar1) {
      bVar1 = Am_Value_List::Test(&local_50);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_28,&local_50);
        local_38.type = 0;
        local_38.value.wrapper_value = (Am_Wrapper *)0x0;
        Am_Value_List::Start(&local_28);
        pAVar2 = Am_Value_List::Get(&local_28);
        Am_Value::operator=(&local_38,pAVar2);
        while( true ) {
          bVar1 = Am_Value_List::Last(&local_28);
          if (bVar1) break;
          pAVar2 = Am_Value_List::Get(&local_28);
          Am_Value::operator=((Am_Value *)self,pAVar2);
          bVar1 = Am_Value::Valid((Am_Value *)self);
          if (bVar1) {
            bVar1 = get_value_to_use_for_value_from((Am_Value *)self);
            if (bVar1) goto LAB_0026d591;
          }
          Am_Value_List::Next(&local_28);
        }
        Am_Value::operator=((Am_Value *)self,&local_38);
        get_value_to_use_for_value_from((Am_Value *)self);
LAB_0026d591:
        Am_Value::~Am_Value(&local_38);
        Am_Value_List::~Am_Value_List(&local_28);
        Am_Value::~Am_Value(&local_50);
        goto LAB_0026d5b2;
      }
    }
    Am_Value::~Am_Value(&local_50);
  }
LAB_0026d5b2:
  Am_Object::~Am_Object(&local_40);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, option_button_value)
{
  Am_Value value;
  Am_Object sub_menu = self.Get_Object(Am_SUB_MENU).Get_Object(Am_SUB_MENU);
  value = sub_menu.Peek(Am_VALUE);
  if (!value.Valid()) {
    Am_Value v;
    v = self.Peek(Am_ITEMS);
    value = Am_No_Value;
    if (v.Valid() && Am_Value_List::Test(v)) {
      Am_Value_List items = v;
      Am_Value firstv;
      //search for a valid item
      items.Start();
      firstv = items.Get(); //save first item
      for (; !items.Last(); items.Next()) {
        value = items.Get();
        if (value.Valid()) {
          if (get_value_to_use_for_value_from(value))
            return value;
        }
      }
      //if get here, then all items are inactive, just use first one
      value = firstv;
      get_value_to_use_for_value_from(value);
    }
  }
  return value;
}